

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<unsigned_int> __thiscall
kj::parse::Many_<kj::parse::Exactly_<char>,_false>::
Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_>::apply
          (Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_> *this,
          Exactly_<char> *subParser,IteratorInput<char,_const_char_*> *input)

{
  bool bVar1;
  NullableValue<kj::_::Tuple<>_> *other;
  Tuple<> *pTVar2;
  int local_60;
  Maybe<kj::_::Tuple<>_> local_4c;
  NullableValue<kj::_::Tuple<>_> local_4a;
  undefined1 local_48 [6];
  NullableValue<kj::_::Tuple<>_> subResult;
  IteratorInput<char,_const_char_*> subInput;
  uint count;
  IteratorInput<char,_const_char_*> *input_local;
  Exactly_<char> *subParser_local;
  
  subInput.best._4_4_ = 0;
  do {
    bVar1 = IteratorInput<char,_const_char_*>::atEnd(input);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    IteratorInput<char,_const_char_*>::IteratorInput
              ((IteratorInput<char,_const_char_*> *)local_48,input);
    Exactly_<char>::operator()
              ((Exactly_<char> *)&local_4c,(IteratorInput<char,_const_char_*> *)subParser);
    other = kj::_::readMaybe<kj::_::Tuple<>>(&local_4c);
    kj::_::NullableValue<kj::_::Tuple<>_>::NullableValue(&local_4a,other);
    Maybe<kj::_::Tuple<>_>::~Maybe(&local_4c);
    pTVar2 = kj::_::NullableValue::operator_cast_to_Tuple_((NullableValue *)&local_4a);
    if (pTVar2 == (Tuple<> *)0x0) {
      local_60 = 3;
    }
    else {
      IteratorInput<char,_const_char_*>::advanceParent
                ((IteratorInput<char,_const_char_*> *)local_48);
      subInput.best._4_4_ = subInput.best._4_4_ + 1;
      local_60 = 0;
    }
    kj::_::NullableValue<kj::_::Tuple<>_>::~NullableValue(&local_4a);
    if (local_60 == 0) {
      local_60 = 0;
    }
    IteratorInput<char,_const_char_*>::~IteratorInput((IteratorInput<char,_const_char_*> *)local_48)
    ;
  } while (local_60 == 0);
  Maybe<unsigned_int>::Maybe((Maybe<unsigned_int> *)this,(uint *)((long)&subInput.best + 4));
  return (Maybe<unsigned_int>)(NullableValue<unsigned_int>)this;
}

Assistant:

static Maybe<uint> apply(const SubParser& subParser, Input& input) {
    uint count = 0;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        ++count;
      } else {
        break;
      }
    }